

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O3

void __thiscall
HighsLp::deleteRowsFromVectors
          (HighsLp *this,HighsInt *new_num_row,HighsIndexCollection *index_collection)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pdVar3;
  HighsInt HVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  HighsInt keep_to_row;
  HighsInt current_set_entry;
  HighsInt keep_from_row;
  HighsInt delete_to_row;
  HighsInt delete_from_row;
  HighsInt to_k;
  HighsInt from_k;
  HighsInt local_60;
  int local_5c;
  HighsInt local_58;
  int local_54;
  int local_50;
  HighsInt local_4c;
  int local_48;
  uint local_44;
  HighsIndexCollection *local_40;
  ulong local_38;
  
  local_40 = index_collection;
  limits(index_collection,(HighsInt *)&local_44,&local_48);
  local_5c = this->num_row_;
  *new_num_row = local_5c;
  if ((int)local_44 <= local_48) {
    local_60 = -1;
    local_58 = 0;
    *new_num_row = 0;
    pbVar1 = (this->row_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = (this->row_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_5c = local_5c + -1;
    uVar5 = local_44;
    while( true ) {
      iVar6 = local_5c;
      updateOutInIndex(local_40,&local_4c,&local_50,&local_54,&local_60,&local_58);
      if (uVar5 == local_44) {
        *new_num_row = local_4c;
      }
      iVar7 = (int)((ulong)((long)pbVar1 - (long)pbVar2) >> 5);
      if (iVar6 <= local_50) break;
      HVar4 = local_60;
      local_38 = (ulong)uVar5;
      if (local_54 <= local_60) {
        iVar6 = *new_num_row;
        lVar8 = (long)local_54 + -1;
        do {
          pdVar3 = (this->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3[iVar6] = pdVar3[lVar8 + 1];
          pdVar3 = (this->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3[iVar6] = pdVar3[lVar8 + 1];
          if (0 < iVar7) {
            std::__cxx11::string::_M_assign
                      ((string *)
                       ((this->row_names_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar6));
            iVar6 = *new_num_row;
            HVar4 = local_60;
          }
          iVar6 = iVar6 + 1;
          *new_num_row = iVar6;
          lVar8 = lVar8 + 1;
        } while (lVar8 < HVar4);
      }
      if ((local_5c <= HVar4) || (uVar5 = (int)local_38 + 1, local_48 <= (int)local_38)) break;
    }
    std::vector<double,_std::allocator<double>_>::resize(&this->row_lower_,(long)*new_num_row);
    std::vector<double,_std::allocator<double>_>::resize(&this->row_upper_,(long)*new_num_row);
    if (0 < iVar7) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&this->row_names_,(long)*new_num_row);
    }
  }
  return;
}

Assistant:

void HighsLp::deleteRowsFromVectors(
    HighsInt& new_num_row, const HighsIndexCollection& index_collection) {
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  // Initialise new_num_row in case none is removed due to from_k > to_k
  new_num_row = this->num_row_;
  if (from_k > to_k) return;

  HighsInt delete_from_row;
  HighsInt delete_to_row;
  HighsInt keep_from_row;
  HighsInt keep_to_row = -1;
  HighsInt current_set_entry = 0;

  HighsInt row_dim = this->num_row_;
  new_num_row = 0;
  bool have_names = (HighsInt)this->row_names_.size() > 0;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_row, delete_to_row,
                     keep_from_row, keep_to_row, current_set_entry);
    if (k == from_k) {
      // Account for the initial rows being kept
      new_num_row = delete_from_row;
    }
    if (delete_to_row >= row_dim - 1) break;
    assert(delete_to_row < row_dim);
    for (HighsInt row = keep_from_row; row <= keep_to_row; row++) {
      this->row_lower_[new_num_row] = this->row_lower_[row];
      this->row_upper_[new_num_row] = this->row_upper_[row];
      if (have_names) this->row_names_[new_num_row] = this->row_names_[row];
      new_num_row++;
    }
    if (keep_to_row >= row_dim - 1) break;
  }
  this->row_lower_.resize(new_num_row);
  this->row_upper_.resize(new_num_row);
  if (have_names) this->row_names_.resize(new_num_row);
}